

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV1SoftSkinBlock(Parser *this)

{
  pointer *pppVar1;
  pointer pMVar2;
  pointer pMVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  iterator __position;
  bool bVar7;
  uint *puVar8;
  _Alloc_hider __s2;
  size_type __n;
  long *__s2_00;
  int iVar9;
  int iVar10;
  byte *pbVar11;
  byte *pbVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> *this_00;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint numVerts;
  uint numWeights;
  string name;
  uint local_dc;
  pair<int,_float> local_d8;
  uint local_d0;
  uint local_cc;
  string local_c8;
  uint local_9c;
  long *local_98;
  pointer local_90;
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *local_58;
  vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_> *local_50;
  vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> *local_48;
  Parser *local_40;
  pointer local_38;
  
  pbVar12 = (byte *)this->filePtr;
  do {
    bVar14 = *pbVar12;
    if (bVar14 == 0x7b) {
      pbVar11 = pbVar12 + 1;
      this->filePtr = (char *)pbVar11;
    }
    else {
      if (bVar14 == 0) {
        return;
      }
      if (bVar14 == 0x7d) {
        this->filePtr = (char *)(pbVar12 + 1);
        return;
      }
      local_dc = 0;
      uVar15 = 0;
      pbVar11 = pbVar12;
      while ((0x20 < (ulong)*pbVar11 || ((0x100003601U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))) {
        pbVar11 = pbVar11 + 1;
        this->filePtr = (char *)pbVar11;
        uVar15 = uVar15 + 1;
      }
      if ((uVar15 & 0xffffffff) != 0) {
        local_98 = local_88;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,pbVar12,pbVar12 + (uVar15 & 0xffffffff));
        pBVar4 = local_90;
        __s2_00 = local_98;
        pMVar2 = (this->m_vMeshes).
                 super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar3 = (this->m_vMeshes).
                 super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pMVar2 != pMVar3) {
          this_00 = &pMVar2->mBoneVertices;
LAB_003f294b:
          if (((pointer)((string *)(this_00 + -0x17))->_M_string_length != pBVar4) ||
             ((pBVar4 != (pointer)0x0 &&
              (iVar9 = bcmp((((_Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                               *)&((string *)(this_00 + -0x17))->_M_dataplus)->_M_impl).
                            super__Vector_impl_data._M_start,__s2_00,(size_t)pBVar4), iVar9 != 0))))
          break;
          pbVar12 = (byte *)this->filePtr;
          while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0)))
          {
            pbVar12 = pbVar12 + 1;
          }
          this->filePtr = (char *)pbVar12;
          ParseLV4MeshLong(this,&local_dc);
          std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::reserve
                    (this_00,(ulong)local_dc);
          if (local_dc != 0) {
            local_50 = (vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_> *)
                       (this_00 + 1);
            uVar18 = 0;
            local_48 = this_00;
            local_40 = this;
            do {
              pbVar12 = (byte *)this->filePtr;
              while (((ulong)*pbVar12 < 0x21 &&
                     ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))) {
                pbVar12 = pbVar12 + 1;
              }
              this->filePtr = (char *)pbVar12;
              local_d0 = uVar18;
              ParseLV4MeshLong(this,&local_cc);
              local_c8._M_dataplus._M_p = (pointer)0x0;
              local_c8._M_string_length = 0;
              local_c8.field_2._M_allocated_capacity = 0;
              std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::
              emplace_back<Assimp::ASE::BoneVertex>(this_00,(BoneVertex *)&local_c8);
              if (local_c8._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_c8._M_dataplus._M_p,
                                local_c8.field_2._M_allocated_capacity -
                                (long)local_c8._M_dataplus._M_p);
              }
              uVar17 = local_cc;
              pBVar4 = (this_00->
                       super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              local_58 = (vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)
                         (pBVar4 + -1);
              std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::reserve
                        ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *)
                         local_58,(ulong)local_cc);
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              local_c8.field_2._M_allocated_capacity =
                   local_c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
              uVar18 = local_d0;
              if (uVar17 != 0) {
                uVar17 = 0;
                local_38 = pBVar4;
                do {
                  local_c8._M_string_length = 0;
                  *local_c8._M_dataplus._M_p = '\0';
                  ParseString(this,&local_c8,"*MESH_SOFTSKINVERTS.Bone");
                  __n = local_c8._M_string_length;
                  __s2._M_p = local_c8._M_dataplus._M_p;
                  local_d8.first = -1;
                  local_d8.second = 0.0;
                  pBVar5 = (((vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_> *)
                            (this_00 + 1))->
                           super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  pBVar6 = (((vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_> *)
                            (this_00 + 1))->
                           super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                  uVar15 = (long)pBVar6 - (long)pBVar5;
                  local_9c = uVar17;
                  if (uVar15 != 0) {
                    uVar13 = 0;
                    uVar16 = 1;
                    do {
                      iVar9 = (int)uVar16;
                      if ((pBVar5[uVar13].mName._M_string_length == __n) &&
                         ((__n == 0 ||
                          (iVar10 = bcmp(pBVar5[uVar13].mName._M_dataplus._M_p,__s2._M_p,__n),
                          iVar10 == 0)))) {
                        local_d8.first = iVar9 + -1;
                        if (iVar9 != 0) goto LAB_003f2c18;
                        break;
                      }
                      bVar7 = uVar16 < (ulong)((long)pBVar6 - (long)pBVar5 >> 5);
                      uVar13 = uVar16;
                      uVar16 = (ulong)(iVar9 + 1);
                    } while (bVar7);
                  }
                  local_d8.first = (int)(uVar15 >> 5);
                  local_78[0] = local_68;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_78,local_c8._M_dataplus._M_p,
                             local_c8._M_dataplus._M_p + local_c8._M_string_length);
                  std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::
                  emplace_back<Assimp::ASE::Bone>(local_50,(Bone *)local_78);
                  if (local_78[0] != local_68) {
                    operator_delete(local_78[0],local_68[0] + 1);
                  }
LAB_003f2c18:
                  this = local_40;
                  ParseLV4MeshFloat(local_40,&local_d8.second);
                  uVar17 = local_9c;
                  __position._M_current =
                       local_38[-1].mBoneWeights.
                       super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      local_38[-1].mBoneWeights.
                      super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
                    _M_realloc_insert<std::pair<int,float>const&>(local_58,__position,&local_d8);
                  }
                  else {
                    *__position._M_current = local_d8;
                    pppVar1 = &local_38[-1].mBoneWeights.
                               super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *pppVar1 = *pppVar1 + 1;
                  }
                  this_00 = local_48;
                  uVar18 = local_d0;
                  uVar17 = uVar17 + 1;
                } while (uVar17 < local_cc);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 < local_dc);
          }
          goto LAB_003f2cae;
        }
LAB_003f298a:
        LogWarning(this,"Encountered unknown mesh in *MESH_SOFTSKINVERTS section");
        pbVar12 = (byte *)this->filePtr;
        while( true ) {
          while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0)))
          {
            pbVar12 = pbVar12 + 1;
          }
          this->filePtr = (char *)pbVar12;
          bVar14 = *pbVar12;
          if (bVar14 == 0x7d) {
            this->filePtr = (char *)(pbVar12 + 1);
            if (local_98 == local_88) {
              return;
            }
            operator_delete(local_98,local_88[0] + 1);
            return;
          }
          if (((9 < (byte)(bVar14 - 0x30)) && (bVar14 != 0x2d)) && (bVar14 != 0x2b)) break;
          while ((0xd < bVar14 || ((0x2401U >> (bVar14 & 0x1f) & 1) == 0))) {
            bVar14 = pbVar12[1];
            pbVar12 = pbVar12 + 1;
          }
          while ((bVar14 == 0xd || (bVar14 == 10))) {
            pbVar11 = pbVar12 + 1;
            pbVar12 = pbVar12 + 1;
            bVar14 = *pbVar11;
          }
          this->filePtr = (char *)pbVar12;
        }
LAB_003f2cae:
        if (local_98 != local_88) {
          operator_delete(local_98,local_88[0] + 1);
        }
        pbVar11 = (byte *)this->filePtr;
      }
    }
    pbVar12 = pbVar11 + 1;
    this->filePtr = (char *)pbVar12;
    while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))) {
      pbVar12 = pbVar12 + 1;
    }
    this->filePtr = (char *)pbVar12;
  } while( true );
  puVar8 = (uint *)(this_00 + 3);
  this_00 = this_00 + 0x1e;
  if ((pointer)(puVar8 + 4) == pMVar3) goto LAB_003f298a;
  goto LAB_003f294b;
}

Assistant:

void Parser::ParseLV1SoftSkinBlock()
{
    // TODO: fix line counting here

    // **************************************************************
    // The soft skin block is formatted differently. There are no
    // nested sections supported and the single elements aren't
    // marked by keywords starting with an asterisk.

    /**
    FORMAT BEGIN

    *MESH_SOFTSKINVERTS {
    <nodename>
    <number of vertices>

    [for <number of vertices> times:]
        <number of weights> [for <number of weights> times:] <bone name> <weight>
    }

    FORMAT END
    */
    // **************************************************************
    while (true)
    {
        if (*filePtr == '}'      )  {++filePtr;return;}
        else if (*filePtr == '\0')  return;
        else if (*filePtr == '{' )  ++filePtr;

        else // if (!IsSpace(*filePtr) && !IsLineEnd(*filePtr))
        {
            ASE::Mesh* curMesh      = NULL;
            unsigned int numVerts   = 0;

            const char* sz = filePtr;
            while (!IsSpaceOrNewLine(*filePtr))++filePtr;

            const unsigned int diff = (unsigned int)(filePtr-sz);
            if (diff)
            {
                std::string name = std::string(sz,diff);
                for (std::vector<ASE::Mesh>::iterator it = m_vMeshes.begin();
                    it != m_vMeshes.end(); ++it)
                {
                    if ((*it).mName == name)
                    {
                        curMesh = & (*it);
                        break;
                    }
                }
                if (!curMesh)
                {
                    LogWarning("Encountered unknown mesh in *MESH_SOFTSKINVERTS section");

                    // Skip the mesh data - until we find a new mesh
                    // or the end of the *MESH_SOFTSKINVERTS section
                    while (true)
                    {
                        SkipSpacesAndLineEnd(&filePtr);
                        if (*filePtr == '}')
                            {++filePtr;return;}
                        else if (!IsNumeric(*filePtr))
                            break;

                        SkipLine(&filePtr);
                    }
                }
                else
                {
                    SkipSpacesAndLineEnd(&filePtr);
                    ParseLV4MeshLong(numVerts);

                    // Reserve enough storage
                    curMesh->mBoneVertices.reserve(numVerts);

                    for (unsigned int i = 0; i < numVerts;++i)
                    {
                        SkipSpacesAndLineEnd(&filePtr);
                        unsigned int numWeights;
                        ParseLV4MeshLong(numWeights);

                        curMesh->mBoneVertices.push_back(ASE::BoneVertex());
                        ASE::BoneVertex& vert = curMesh->mBoneVertices.back();

                        // Reserve enough storage
                        vert.mBoneWeights.reserve(numWeights);

                        std::string bone;
                        for (unsigned int w = 0; w < numWeights;++w) {
                            bone.clear();
                            ParseString(bone,"*MESH_SOFTSKINVERTS.Bone");

                            // Find the bone in the mesh's list
                            std::pair<int,ai_real> me;
                            me.first = -1;

                            for (unsigned int n = 0; n < curMesh->mBones.size();++n) {
                                if (curMesh->mBones[n].mName == bone) {
                                    me.first = n;
                                    break;
                                }
                            }
                            if (-1 == me.first) {
                                // We don't have this bone yet, so add it to the list
                                me.first = static_cast<int>( curMesh->mBones.size() );
                                curMesh->mBones.push_back( ASE::Bone( bone ) );
                            }
                            ParseLV4MeshFloat( me.second );

                            // Add the new bone weight to list
                            vert.mBoneWeights.push_back(me);
                        }
                    }
                }
            }
        }
        ++filePtr;
        SkipSpacesAndLineEnd(&filePtr);
    }
}